

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void CollectColorRedTransforms_SSE2
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_red,
               uint32_t *histo)

{
  uint7 uVar1;
  uint7 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int in_ECX;
  ulong uVar12;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  short in_R8W;
  long in_R9;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int left_over;
  __m128i I;
  __m128i F1;
  __m128i F0;
  __m128i E1;
  __m128i E0;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  __m128i in1;
  __m128i in0;
  uint16_t values [8];
  int x;
  int i;
  uint32_t *src;
  int y;
  __m128i mask;
  __m128i mask_g;
  __m128i mults_g;
  undefined1 in_stack_fffffffffffffca8 [16];
  ulong in_stack_fffffffffffffcb8;
  uint32_t *in_stack_fffffffffffffcc0;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_288;
  undefined8 uStack_280;
  int local_270;
  int local_26c;
  long local_268;
  int local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong *local_208;
  ulong *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined4 local_194;
  undefined4 local_190;
  uint local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong uStack_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  ulong local_28;
  uint32_t *puStack_20;
  ulong local_18;
  ulong uStack_10;
  
  uVar11 = (uint)(int)(short)(in_R8W << 8) >> 5;
  local_18c = uVar11 & 0xffff;
  local_238 = CONCAT44(uVar11,uVar11) & 0xffff0000ffff;
  uStack_230 = CONCAT44(uVar11,uVar11) & 0xffff0000ffff;
  local_190 = 0xff00;
  local_4c = 0xff00;
  local_50 = 0xff00;
  local_54 = 0xff00;
  local_58 = 0xff00;
  local_248 = 0xff000000ff00;
  uStack_240 = 0xff000000ff00;
  local_194 = 0xff;
  local_2c = 0xff;
  local_30 = 0xff;
  local_34 = 0xff;
  local_38 = 0xff;
  local_258 = 0xff000000ff;
  uStack_250 = 0xff000000ff;
  for (local_25c = 0; local_25c < in_ECX; local_25c = local_25c + 1) {
    local_268 = in_RDI + (long)(local_25c * in_ESI) * 4;
    for (local_270 = 0; local_270 + 8 <= (int)in_EDX; local_270 = local_270 + 8) {
      local_200 = (ulong *)(local_268 + (long)local_270 * 4);
      local_118 = *local_200;
      uStack_110 = local_200[1];
      local_208 = (ulong *)(local_268 + (long)(local_270 + 4) * 4);
      local_138 = *local_208;
      uStack_130 = local_208[1];
      local_d8 = local_118 & 0xff000000ff00;
      uStack_d0 = uStack_110 & 0xff000000ff00;
      local_f8 = local_138 & 0xff000000ff00;
      uStack_f0 = uStack_130 & 0xff000000ff00;
      local_9c = 0x10;
      local_98._0_4_ = (uint)local_118;
      uStack_90._0_4_ = (uint)uStack_110;
      local_bc = 0x10;
      local_b8._0_4_ = (uint)local_138;
      uStack_b0._0_4_ = (uint)uStack_130;
      auVar4._8_8_ = uStack_d0;
      auVar4._0_8_ = local_d8;
      auVar13._8_8_ = uStack_230;
      auVar13._0_8_ = local_238;
      auVar13 = pmulhw(auVar4,auVar13);
      auVar3._8_8_ = uStack_f0;
      auVar3._0_8_ = local_f8;
      auVar14._8_8_ = uStack_230;
      auVar14._0_8_ = local_238;
      auVar14 = pmulhw(auVar3,auVar14);
      local_2f8 = auVar13._0_8_;
      uStack_2f0 = auVar13._8_8_;
      local_1d8 = local_2f8;
      uVar9 = local_1d8;
      uStack_1d0 = uStack_2f0;
      uVar10 = uStack_1d0;
      local_1c8._0_1_ = (char)(local_118 >> 0x10);
      local_1c8._1_1_ = (char)(local_118 >> 0x18);
      local_1c8._4_1_ = (char)(local_118 >> 0x30);
      local_1c8._5_1_ = (char)(local_118 >> 0x38);
      uStack_1c0._0_1_ = (char)(uStack_110 >> 0x10);
      uStack_1c0._1_1_ = (char)(uStack_110 >> 0x18);
      uStack_1c0._4_1_ = (char)(uStack_110 >> 0x30);
      uStack_1c0._5_1_ = (char)(uStack_110 >> 0x38);
      local_1d8._0_1_ = auVar13[0];
      local_1d8._1_1_ = auVar13[1];
      local_1d8._2_1_ = auVar13[2];
      local_1d8._3_1_ = auVar13[3];
      local_1d8._4_1_ = auVar13[4];
      local_1d8._5_1_ = auVar13[5];
      local_1d8._6_1_ = auVar13[6];
      local_1d8._7_1_ = auVar13[7];
      uStack_1d0._0_1_ = auVar13[8];
      uStack_1d0._1_1_ = auVar13[9];
      uStack_1d0._2_1_ = auVar13[10];
      uStack_1d0._3_1_ = auVar13[0xb];
      uStack_1d0._4_1_ = auVar13[0xc];
      uStack_1d0._5_1_ = auVar13[0xd];
      uStack_1d0._6_1_ = auVar13[0xe];
      uStack_1d0._7_1_ = auVar13[0xf];
      local_308 = auVar14._0_8_;
      uStack_300 = auVar14._8_8_;
      local_1f8 = local_308;
      uVar7 = local_1f8;
      uStack_1f0 = uStack_300;
      uVar8 = uStack_1f0;
      local_1e8._0_1_ = (char)(local_138 >> 0x10);
      local_1e8._1_1_ = (char)(local_138 >> 0x18);
      local_1e8._4_1_ = (char)(local_138 >> 0x30);
      local_1e8._5_1_ = (char)(local_138 >> 0x38);
      uStack_1e0._0_1_ = (char)(uStack_130 >> 0x10);
      uStack_1e0._1_1_ = (char)(uStack_130 >> 0x18);
      uStack_1e0._4_1_ = (char)(uStack_130 >> 0x30);
      uStack_1e0._5_1_ = (char)(uStack_130 >> 0x38);
      local_1f8._0_1_ = auVar14[0];
      local_1f8._1_1_ = auVar14[1];
      local_1f8._2_1_ = auVar14[2];
      local_1f8._3_1_ = auVar14[3];
      local_1f8._4_1_ = auVar14[4];
      local_1f8._5_1_ = auVar14[5];
      local_1f8._6_1_ = auVar14[6];
      local_1f8._7_1_ = auVar14[7];
      uStack_1f0._0_1_ = auVar14[8];
      uStack_1f0._1_1_ = auVar14[9];
      uStack_1f0._2_1_ = auVar14[10];
      uStack_1f0._3_1_ = auVar14[0xb];
      uStack_1f0._4_1_ = auVar14[0xc];
      uStack_1f0._5_1_ = auVar14[0xd];
      uStack_1f0._6_1_ = auVar14[0xe];
      uStack_1f0._7_1_ = auVar14[0xf];
      uVar1 = CONCAT16(-local_1d8._6_1_,
                       CONCAT15(local_1c8._5_1_ - local_1d8._5_1_,
                                CONCAT14(local_1c8._4_1_ - local_1d8._4_1_,
                                         CONCAT13(-local_1d8._3_1_,
                                                  CONCAT12(-local_1d8._2_1_,
                                                           CONCAT11(local_1c8._1_1_ -
                                                                    local_1d8._1_1_,
                                                                    (char)local_1c8 -
                                                                    (char)local_1d8))))));
      local_158 = CONCAT17(-local_1d8._7_1_,uVar1);
      uVar2 = CONCAT16(-uStack_1d0._6_1_,
                       CONCAT15(uStack_1c0._5_1_ - uStack_1d0._5_1_,
                                CONCAT14(uStack_1c0._4_1_ - uStack_1d0._4_1_,
                                         CONCAT13(-uStack_1d0._3_1_,
                                                  CONCAT12(-uStack_1d0._2_1_,
                                                           CONCAT11(uStack_1c0._1_1_ -
                                                                    uStack_1d0._1_1_,
                                                                    (char)uStack_1c0 -
                                                                    (char)uStack_1d0))))));
      uStack_150 = CONCAT17(-uStack_1d0._7_1_,uVar2);
      local_18 = (ulong)uVar1 & 0xff000000ff;
      uStack_10 = (ulong)uVar2 & 0xff000000ff;
      uVar1 = CONCAT16(-local_1f8._6_1_,
                       CONCAT15(local_1e8._5_1_ - local_1f8._5_1_,
                                CONCAT14(local_1e8._4_1_ - local_1f8._4_1_,
                                         CONCAT13(-local_1f8._3_1_,
                                                  CONCAT12(-local_1f8._2_1_,
                                                           CONCAT11(local_1e8._1_1_ -
                                                                    local_1f8._1_1_,
                                                                    (char)local_1e8 -
                                                                    (char)local_1f8))))));
      local_178 = CONCAT17(-local_1f8._7_1_,uVar1);
      uVar2 = CONCAT16(-uStack_1f0._6_1_,
                       CONCAT15(uStack_1e0._5_1_ - uStack_1f0._5_1_,
                                CONCAT14(uStack_1e0._4_1_ - uStack_1f0._4_1_,
                                         CONCAT13(-uStack_1f0._3_1_,
                                                  CONCAT12(-uStack_1f0._2_1_,
                                                           CONCAT11(uStack_1e0._1_1_ -
                                                                    uStack_1f0._1_1_,
                                                                    (char)uStack_1e0 -
                                                                    (char)uStack_1f0))))));
      uStack_170 = CONCAT17(-uStack_1f0._7_1_,uVar2);
      in_stack_fffffffffffffcb8 = (ulong)uVar1 & 0xff000000ff;
      in_stack_fffffffffffffcc0 = (uint32_t *)((ulong)uVar2 & 0xff000000ff);
      auVar6._8_8_ = uStack_10;
      auVar6._0_8_ = local_18;
      auVar5._8_8_ = in_stack_fffffffffffffcc0;
      auVar5._0_8_ = in_stack_fffffffffffffcb8;
      in_stack_fffffffffffffca8 = packssdw(auVar6,auVar5);
      local_1a0 = &local_288;
      local_1b8 = in_stack_fffffffffffffca8._0_8_;
      uStack_1b0 = in_stack_fffffffffffffca8._8_8_;
      local_288 = local_1b8;
      uStack_280 = uStack_1b0;
      for (local_26c = 0; local_26c < 8; local_26c = local_26c + 1) {
        uVar12 = (ulong)*(ushort *)((long)&local_288 + (long)local_26c * 2);
        *(int *)(in_R9 + uVar12 * 4) = *(int *)(in_R9 + uVar12 * 4) + 1;
      }
      local_1f8 = uVar7;
      uStack_1f0 = uVar8;
      local_1e8 = CONCAT44((uint)(local_138 >> 0x30),(uint)local_b8 >> 0x10);
      uStack_1e0 = CONCAT44((uint)(uStack_130 >> 0x30),(uint)uStack_b0 >> 0x10);
      local_1d8 = uVar9;
      uStack_1d0 = uVar10;
      local_1c8 = CONCAT44((uint)(local_118 >> 0x30),(uint)local_98 >> 0x10);
      uStack_1c0 = CONCAT44((uint)(uStack_110 >> 0x30),(uint)uStack_90 >> 0x10);
      local_188 = local_258;
      uStack_180 = uStack_250;
      local_168 = local_258;
      uStack_160 = uStack_250;
      local_148 = local_248;
      uStack_140 = uStack_240;
      local_128 = local_248;
      uStack_120 = uStack_240;
      local_108 = local_238;
      uStack_100 = uStack_230;
      local_e8 = local_238;
      uStack_e0 = uStack_230;
      local_b8 = local_138;
      uStack_b0 = uStack_130;
      local_98 = local_118;
      uStack_90 = uStack_110;
      local_28 = in_stack_fffffffffffffcb8;
      puStack_20 = in_stack_fffffffffffffcc0;
    }
  }
  if ((in_EDX & 7) != 0) {
    local_88 = local_238;
    uStack_80 = uStack_230;
    local_78 = local_18c;
    local_74 = local_18c;
    local_70 = local_18c;
    local_6c = local_18c;
    local_68 = local_248;
    uStack_60 = uStack_240;
    local_48 = local_258;
    uStack_40 = uStack_250;
    VP8LCollectColorRedTransforms_C
              (in_stack_fffffffffffffcc0,(int)(in_stack_fffffffffffffcb8 >> 0x20),
               (int)in_stack_fffffffffffffcb8,in_stack_fffffffffffffca8._12_4_,
               in_stack_fffffffffffffca8._8_4_,in_stack_fffffffffffffca8._0_8_);
  }
  return;
}

Assistant:

static void CollectColorRedTransforms_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                           int stride,
                                           int tile_width, int tile_height,
                                           int green_to_red, uint32_t histo[]) {
  const __m128i mults_g = MK_CST_16(0, CST_5b(green_to_red));
  const __m128i mask_g = _mm_set1_epi32(0x00ff00);  // green mask
  const __m128i mask = _mm_set1_epi32(0xff);

  int y;
  for (y = 0; y < tile_height; ++y) {
    const uint32_t* const src = argb + y * stride;
    int i, x;
    for (x = 0; x + SPAN <= tile_width; x += SPAN) {
      uint16_t values[SPAN];
      const __m128i in0 = _mm_loadu_si128((__m128i*)&src[x +        0]);
      const __m128i in1 = _mm_loadu_si128((__m128i*)&src[x + SPAN / 2]);
      const __m128i A0 = _mm_and_si128(in0, mask_g);    // 0 0  | g 0
      const __m128i A1 = _mm_and_si128(in1, mask_g);
      const __m128i B0 = _mm_srli_epi32(in0, 16);       // 0 0  | x r
      const __m128i B1 = _mm_srli_epi32(in1, 16);
      const __m128i C0 = _mm_mulhi_epi16(A0, mults_g);  // 0 0  | x dr
      const __m128i C1 = _mm_mulhi_epi16(A1, mults_g);
      const __m128i E0 = _mm_sub_epi8(B0, C0);          // x x  | x r'
      const __m128i E1 = _mm_sub_epi8(B1, C1);
      const __m128i F0 = _mm_and_si128(E0, mask);       // 0 0  | 0 r'
      const __m128i F1 = _mm_and_si128(E1, mask);
      const __m128i I = _mm_packs_epi32(F0, F1);
      _mm_storeu_si128((__m128i*)values, I);
      for (i = 0; i < SPAN; ++i) ++histo[values[i]];
    }
  }
  {
    const int left_over = tile_width & (SPAN - 1);
    if (left_over > 0) {
      VP8LCollectColorRedTransforms_C(argb + tile_width - left_over, stride,
                                      left_over, tile_height,
                                      green_to_red, histo);
    }
  }
}